

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.h
# Opt level: O2

BVHNodeRecord<embree::NodeRefPtr<4>_> * __thiscall
embree::avx::BVHBuilderMorton::
BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::avx::SetBVHNBounds<4>,_embree::avx::CreateMortonLeaf<4,_embree::TriangleMv<4>_>,_embree::avx::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
::recurse(BVHNodeRecord<embree::NodeRefPtr<4>_> *__return_storage_ptr__,
         BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::avx::SetBVHNBounds<4>,_embree::avx::CreateMortonLeaf<4,_embree::TriangleMv<4>_>,_embree::avx::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
         *this,size_t depth,range<unsigned_int> *current,CachedAllocator alloc,bool toplevel)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 *paVar1;
  atomic<unsigned_long> *paVar2;
  char *pcVar3;
  undefined1 auVar4 [16];
  Vec3fx VVar5;
  undefined4 uVar6;
  ThreadLocal2 *this_00;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar7;
  CachedAllocator alloc_00;
  CachedAllocator alloc_01;
  uint uVar8;
  char cVar9;
  size_t i;
  long *plVar10;
  MutexSys *this_01;
  BuildPrim *pBVar11;
  long lVar12;
  anon_union_16_2_47237d3f_for_Vec3fx_0 *paVar13;
  float *pfVar14;
  size_t sVar15;
  runtime_error *this_02;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar20;
  range<unsigned_int> *prVar21;
  uint uVar22;
  uint uVar23;
  size_type sVar24;
  uint uVar25;
  ulong uVar26;
  Vec3fx *pVVar27;
  ulong uVar28;
  char *pcVar29;
  ulong uVar30;
  bool bVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar34;
  size_t depth_local;
  BVHNodeRecord<embree::NodeRefPtr<4>_> *local_2c8;
  blocked_range<unsigned_long> local_2c0;
  range<unsigned_int> local_2a8;
  range<unsigned_int> local_2a0 [8];
  anon_class_8_1_898bcfc2 local_260;
  task_group_context context;
  anon_class_32_4_e5015336 local_1d8;
  BVHNodeRecord<embree::NodeRefPtr<4>_> bounds [8];
  ulong uVar19;
  
  depth_local = depth;
  if (alloc.alloc == (FastAllocator *)0x0) {
    alloc.alloc = (this->createAllocator->super_Create).allocator;
    plVar10 = (long *)__tls_get_addr(&PTR_021f8d38);
    this_01 = (MutexSys *)*plVar10;
    if (this_01 == (MutexSys *)0x0) {
      this_01 = (MutexSys *)FastAllocator::ThreadLocal2::operator_new(0xc0);
      MutexSys::MutexSys(this_01);
      this_01[1].mutex = (void *)0x0;
      this_01[8].mutex = this_01;
      auVar32 = ZEXT816(0) << 0x40;
      *(undefined1 (*) [32])(this_01 + 9) = ZEXT1632(auVar32);
      *(undefined1 (*) [32])(this_01 + 0xb) = ZEXT1632(auVar32);
      this_01[0x10].mutex = this_01;
      *(undefined1 (*) [32])(this_01 + 0x11) = ZEXT1632(auVar32);
      *(undefined1 (*) [32])(this_01 + 0x13) = ZEXT1632(auVar32);
      *plVar10 = (long)this_01;
      bounds[0].ref.ptr = (size_t)&FastAllocator::s_thread_local_allocators_lock;
      bounds[0]._8_1_ = 1;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      context.my_cpu_ctl_env = (uint64_t)this_01;
      std::
      vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
      ::
      emplace_back<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>
                ((vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
                  *)FastAllocator::s_thread_local_allocators,
                 (unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                  *)&context);
      std::
      unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
      ::~unique_ptr((unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                     *)&context);
      Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)bounds);
    }
    alloc.talloc0 = (ThreadLocal *)(this_01 + 8);
    alloc.talloc1 = (ThreadLocal *)(this_01 + 0x10);
    if ((alloc.alloc)->use_single_mode != false) {
      alloc.talloc1 = alloc.talloc0;
    }
  }
  if ((toplevel) &&
     ((ulong)(current->_end - current->_begin) <= (this->super_Settings).singleThreadThreshold)) {
    (**(this->progressMonitor->super_BuildProgressMonitor)._vptr_BuildProgressMonitor)();
  }
  if ((this->super_Settings).maxDepth <= depth + 8) {
LAB_00dfa33e:
    alloc_01.talloc0 = alloc.talloc0;
    alloc_01.alloc = alloc.alloc;
    alloc_01.talloc1 = alloc.talloc1;
    createLargeLeaf(__return_storage_ptr__,this,depth,current,alloc_01);
    return __return_storage_ptr__;
  }
  uVar20 = (ulong)current->_begin;
  uVar22 = current->_end;
  uVar30 = (ulong)uVar22;
  if ((ulong)(uVar22 - current->_begin) <= (this->super_Settings).minLeafSize) goto LAB_00dfa33e;
  pBVar11 = this->morton;
  uVar17 = pBVar11[uVar20].field_0.field_0.code;
  uVar22 = pBVar11[uVar22 - 1].field_0.field_0.code;
  if (uVar17 == uVar22) {
LAB_00dfa36e:
    recreateMortonCodes(this,current);
    pBVar11 = this->morton;
    uVar22 = current->_begin;
    uVar20 = (ulong)uVar22;
    uVar17 = current->_end;
    uVar30 = (ulong)uVar17;
    uVar23 = pBVar11[uVar20].field_0.field_0.code;
    uVar25 = pBVar11[uVar17 - 1].field_0.field_0.code;
    if (uVar23 != uVar25) {
      uVar25 = uVar25 ^ uVar23;
      iVar16 = 0x1f;
      if (uVar25 != 0) {
        for (; uVar25 >> iVar16 == 0; iVar16 = iVar16 + -1) {
        }
      }
      if (iVar16 != -1) goto LAB_00df9d7e;
    }
    uVar17 = uVar22 + uVar17 >> 1;
    uVar28 = (ulong)uVar17;
    local_2a8._end = uVar17;
    local_2a8._begin = uVar22;
  }
  else {
    uVar22 = uVar22 ^ uVar17;
    iVar16 = 0x1f;
    if (uVar22 != 0) {
      for (; uVar22 >> iVar16 == 0; iVar16 = iVar16 + -1) {
      }
    }
    if (iVar16 == -1) goto LAB_00dfa36e;
LAB_00df9d7e:
    uVar19 = uVar20;
    uVar18 = uVar30;
    while( true ) {
      uVar28 = uVar18;
      if ((int)uVar19 + 1 == (int)uVar28) break;
      uVar18 = (ulong)((uint)((int)uVar28 + (int)uVar19) >> 1);
      if ((pBVar11[uVar18].field_0.field_0.code & 0x80000000U >> (~(byte)iVar16 & 0x1f)) == 0) {
        uVar19 = uVar18;
        uVar18 = uVar28;
      }
    }
    local_2a8 = (range<unsigned_int>)(uVar20 | uVar28 << 0x20);
  }
  local_2a0[0] = (range<unsigned_int>)(uVar30 << 0x20 | uVar28);
  for (uVar30 = 2; uVar30 < (this->super_Settings).branchingFactor; uVar30 = uVar30 + 1) {
    uVar22 = 0;
    uVar17 = 0xffffffff;
    for (uVar23 = 0; uVar20 = (ulong)uVar23, uVar20 < uVar30; uVar23 = uVar23 + 1) {
      uVar25 = (&local_2a8)[uVar20]._end - local_2a0[uVar20 - 1]._begin;
      uVar8 = uVar23;
      if ((ulong)uVar25 <= (this->super_Settings).minLeafSize || uVar25 <= uVar22) {
        uVar25 = uVar22;
        uVar8 = uVar17;
      }
      uVar17 = uVar8;
      uVar22 = uVar25;
    }
    if (uVar17 == 0xffffffff) break;
    prVar21 = local_2a0 + (long)(int)uVar17 + -1;
    uVar28 = (ulong)prVar21->_begin;
    uVar20 = (ulong)(&local_2a8)[(int)uVar17]._end;
    uVar22 = pBVar11[uVar28].field_0.field_0.code;
    uVar23 = pBVar11[(&local_2a8)[(int)uVar17]._end - 1].field_0.field_0.code;
    if (uVar22 == uVar23) {
LAB_00df9ec7:
      recreateMortonCodes(this,prVar21);
      pBVar11 = this->morton;
      uVar22 = prVar21->_begin;
      uVar28 = (ulong)uVar22;
      uVar17 = (&local_2a8)[(int)uVar17]._end;
      uVar20 = (ulong)uVar17;
      uVar23 = pBVar11[uVar28].field_0.field_0.code;
      uVar25 = pBVar11[uVar17 - 1].field_0.field_0.code;
      if (uVar23 != uVar25) {
        uVar25 = uVar25 ^ uVar23;
        iVar16 = 0x1f;
        if (uVar25 != 0) {
          for (; uVar25 >> iVar16 == 0; iVar16 = iVar16 + -1) {
          }
        }
        if (iVar16 != -1) goto LAB_00df9e64;
      }
      uVar17 = uVar22 + uVar17 >> 1;
      uVar19 = (ulong)uVar17;
      sVar24 = CONCAT44(uVar17,uVar22);
    }
    else {
      uVar23 = uVar23 ^ uVar22;
      iVar16 = 0x1f;
      if (uVar23 != 0) {
        for (; uVar23 >> iVar16 == 0; iVar16 = iVar16 + -1) {
        }
      }
      if (iVar16 == -1) goto LAB_00df9ec7;
LAB_00df9e64:
      uVar18 = uVar28;
      uVar26 = uVar20;
      while( true ) {
        uVar19 = uVar26;
        if ((int)uVar18 + 1 == (int)uVar19) break;
        uVar26 = (ulong)((uint)((int)uVar19 + (int)uVar18) >> 1);
        if ((pBVar11[uVar26].field_0.field_0.code & 0x80000000U >> (~(byte)iVar16 & 0x1f)) == 0) {
          uVar18 = uVar26;
          uVar26 = uVar19;
        }
      }
      sVar24 = uVar28 | uVar19 << 0x20;
    }
    *prVar21 = *(range<unsigned_int> *)(&local_2c0.my_grainsize + uVar30);
    (&local_2c0.my_grainsize)[uVar30] = sVar24;
    local_2a0[uVar30 - 1] = (range<unsigned_int>)(uVar20 << 0x20 | uVar19);
  }
  local_2c0.my_end = 0x80;
  this_00 = (alloc.talloc0)->parent;
  if (alloc.alloc != (this_00->alloc)._M_b._M_p) {
    context.my_cancellation_requested.super___atomic_base<unsigned_int>._M_i._0_1_ = 1;
    context.my_cpu_ctl_env = (uint64_t)this_00;
    MutexSys::lock(&this_00->mutex);
    if ((this_00->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar2 = &((this_00->alloc)._M_b._M_p)->bytesUsed;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesUsed + (this_00->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar2 = &((this_00->alloc)._M_b._M_p)->bytesFree;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (((this_00->alloc0).end + (this_00->alloc1).end) -
           ((this_00->alloc0).cur + (this_00->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar2 = &((this_00->alloc)._M_b._M_p)->bytesWasted;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (this_00->alloc1).bytesWasted + (this_00->alloc0).bytesWasted;
      UNLOCK();
    }
    auVar33 = ZEXT1632(ZEXT816(0) << 0x40);
    (this_00->alloc0).end = auVar33._0_8_;
    (this_00->alloc0).allocBlockSize = auVar33._8_8_;
    (this_00->alloc0).bytesUsed = auVar33._16_8_;
    (this_00->alloc0).bytesWasted = auVar33._24_8_;
    (this_00->alloc0).ptr = (char *)auVar33._0_8_;
    (this_00->alloc0).cur = auVar33._8_8_;
    (this_00->alloc0).end = auVar33._16_8_;
    (this_00->alloc0).allocBlockSize = auVar33._24_8_;
    auVar33 = ZEXT1632(ZEXT816(0) << 0x40);
    if (alloc.alloc == (FastAllocator *)0x0) {
      (this_00->alloc1).end = auVar33._0_8_;
      (this_00->alloc1).allocBlockSize = auVar33._8_8_;
      (this_00->alloc1).bytesUsed = auVar33._16_8_;
      (this_00->alloc1).bytesWasted = auVar33._24_8_;
      (this_00->alloc1).ptr = (char *)auVar33._0_8_;
      (this_00->alloc1).cur = auVar33._8_8_;
      (this_00->alloc1).end = auVar33._16_8_;
      (this_00->alloc1).allocBlockSize = auVar33._24_8_;
    }
    else {
      (this_00->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (this_00->alloc1).ptr = (char *)auVar33._0_8_;
      (this_00->alloc1).cur = auVar33._8_8_;
      (this_00->alloc1).end = auVar33._16_8_;
      (this_00->alloc1).allocBlockSize = auVar33._24_8_;
      (this_00->alloc1).end = auVar33._0_8_;
      (this_00->alloc1).allocBlockSize = auVar33._8_8_;
      (this_00->alloc1).bytesUsed = auVar33._16_8_;
      (this_00->alloc1).bytesWasted = auVar33._24_8_;
      (this_00->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (this_00->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    bounds[0].ref.ptr = (size_t)&FastAllocator::s_thread_local_allocators_lock;
    bounds[0]._8_1_ = 1;
    local_1d8.bounds = (BVHNodeRecord<embree::NodeRefPtr<4>_> (*) [8])this_00;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    std::
    vector<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
    ::push_back(&(alloc.alloc)->thread_local_allocators,(value_type *)&local_1d8);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)bounds);
    Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)&context);
  }
  (alloc.talloc0)->bytesUsed = (alloc.talloc0)->bytesUsed + local_2c0.my_end;
  sVar15 = (alloc.talloc0)->cur;
  uVar20 = (ulong)(-(int)sVar15 & 0xf);
  uVar28 = sVar15 + local_2c0.my_end + uVar20;
  (alloc.talloc0)->cur = uVar28;
  if ((alloc.talloc0)->end < uVar28) {
    (alloc.talloc0)->cur = sVar15;
    if ((alloc.talloc0)->allocBlockSize < local_2c0.my_end << 2) {
      pcVar29 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_2c0);
    }
    else {
      bounds[0].ref.ptr = (alloc.talloc0)->allocBlockSize;
      pcVar29 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)bounds);
      (alloc.talloc0)->ptr = pcVar29;
      sVar15 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar15;
      (alloc.talloc0)->end = bounds[0].ref.ptr;
      (alloc.talloc0)->cur = local_2c0.my_end;
      if (bounds[0].ref.ptr < local_2c0.my_end) {
        (alloc.talloc0)->cur = 0;
        bounds[0].ref.ptr = (alloc.talloc0)->allocBlockSize;
        pcVar29 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)bounds);
        (alloc.talloc0)->ptr = pcVar29;
        sVar15 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar15;
        (alloc.talloc0)->end = bounds[0].ref.ptr;
        (alloc.talloc0)->cur = local_2c0.my_end;
        if (bounds[0].ref.ptr < local_2c0.my_end) {
          (alloc.talloc0)->cur = 0;
          pcVar29 = (char *)0x0;
        }
        else {
          (alloc.talloc0)->bytesWasted = sVar15;
        }
      }
      else {
        (alloc.talloc0)->bytesWasted = sVar15;
      }
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar20;
    pcVar29 = (alloc.talloc0)->ptr + (uVar28 - local_2c0.my_end);
  }
  auVar32._8_4_ = 0x7f800000;
  auVar32._0_8_ = 0x7f8000007f800000;
  auVar32._12_4_ = 0x7f800000;
  *(undefined1 (*) [16])(pcVar29 + 0x60) = auVar32;
  *(undefined1 (*) [16])(pcVar29 + 0x40) = auVar32;
  *(undefined1 (*) [16])(pcVar29 + 0x20) = auVar32;
  aVar34.m128[2] = -INFINITY;
  aVar34._0_8_ = 0xff800000ff800000;
  aVar34.m128[3] = -INFINITY;
  *(anon_union_16_2_47237d3f_for_Vec3fx_0 *)(pcVar29 + 0x70) = aVar34;
  *(anon_union_16_2_47237d3f_for_Vec3fx_0 *)(pcVar29 + 0x50) = aVar34;
  *(anon_union_16_2_47237d3f_for_Vec3fx_0 *)(pcVar29 + 0x30) = aVar34;
  for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
    pcVar3 = pcVar29 + lVar12 * 8;
    pcVar3[0] = '\b';
    pcVar3[1] = '\0';
    pcVar3[2] = '\0';
    pcVar3[3] = '\0';
    pcVar3[4] = '\0';
    pcVar3[5] = '\0';
    pcVar3[6] = '\0';
    pcVar3[7] = '\0';
  }
  local_2c8 = __return_storage_ptr__;
  if ((this->super_Settings).singleThreadThreshold < (ulong)(current->_end - current->_begin)) {
    local_1d8.bounds = &bounds;
    local_1d8.depth = &depth_local;
    local_1d8.children = (range<unsigned_int> (*) [8])&local_2a8;
    local_1d8.this =
         (BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::TriangleM<4>_>,_embree::sse2::CalculateMeshBounds<embree::TriangleMesh>,_embree::Scene::BuildProgressMonitorInterface>
          *)this;
    tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX)
    ;
    local_2c0.my_begin = 0;
    local_2c0.my_grainsize = 1;
    local_2c0.my_end = uVar30;
    local_260.func = &local_1d8;
    tbb::detail::d1::
    parallel_for<tbb::detail::d1::blocked_range<unsigned_long>,embree::parallel_for<unsigned_long,embree::avx::BVHBuilderMorton::BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>>,embree::FastAllocator::CachedAllocator,embree::BVHN<4>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Create,embree::avx::SetBVHNBounds<4>,embree::avx::CreateMortonLeaf<4,embree::TriangleMv<4>>,embree::avx::CalculateMeshBounds<embree::TriangleMesh>,embree::Scene::BuildProgressMonitorInterface>::recurse(unsigned_long,embree::range<unsigned_int>const&,embree::FastAllocator::CachedAllocator,bool)::_lambda(embree::range<unsigned_long>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::avx::BVHBuilderMorton::BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>>,embree::FastAllocator::CachedAllocator,embree::BVHN<4>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Create,embree::avx::SetBVHNBounds<4>,embree::avx::CreateMortonLeaf<4,embree::TriangleMv<4>>,embree::avx::CalculateMeshBounds<embree::TriangleMesh>,embree::Scene::BuildProgressMonitorInterface>::recurse(unsigned_long,embree::range<unsigned_int>const&,embree::FastAllocator::CachedAllocator,bool)::_lambda(embree::range<unsigned_long>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&)_1_>
              (&local_2c0,&local_260,&context);
    cVar9 = tbb::detail::r1::is_group_execution_cancelled(&context);
    if (cVar9 != '\0') {
      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_02,"task cancelled");
      __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tbb::detail::d1::task_group_context::~task_group_context(&context);
    auVar32._8_4_ = 0x7f800000;
    auVar32._0_8_ = 0x7f8000007f800000;
    auVar32._12_4_ = 0x7f800000;
    aVar34.m128[2] = -INFINITY;
    aVar34._0_8_ = 0xff800000ff800000;
    aVar34.m128[3] = -INFINITY;
  }
  else {
    prVar21 = &local_2a8;
    pVVar27 = &bounds[0].bounds.upper;
    uVar20 = uVar30;
    while (bVar31 = uVar20 != 0, uVar20 = uVar20 - 1, bVar31) {
      alloc_00.talloc0 = alloc.talloc0;
      alloc_00.alloc = alloc.alloc;
      alloc_00.talloc1 = alloc.talloc1;
      recurse((BVHNodeRecord<embree::NodeRefPtr<4>_> *)&context,this,depth_local + 1,prVar21,
              alloc_00,false);
      aVar34.m128[2] = -INFINITY;
      aVar34._0_8_ = 0xff800000ff800000;
      aVar34.m128[3] = -INFINITY;
      auVar32._8_4_ = 0x7f800000;
      auVar32._0_8_ = 0x7f8000007f800000;
      auVar32._12_4_ = 0x7f800000;
      *(uint64_t *)(pVVar27 + -2) = context.my_cpu_ctl_env;
      *(anon_union_8_2_d71db6ad_for_task_group_context_11 *)(pVVar27 + -1) = context.field_6;
      *(context_list **)((long)&(((BBox3fx *)(pVVar27 + -1))->lower).field_0 + 8) =
           context.my_context_list;
      *(intrusive_list_node **)&pVVar27->field_0 = context.my_node.my_prev_node;
      *(intrusive_list_node **)((long)&pVVar27->field_0 + 8) = context.my_node.my_next_node;
      prVar21 = prVar21 + 1;
      pVVar27 = pVVar27 + 3;
    }
  }
  paVar13 = &bounds[0].bounds.upper.field_0;
  for (uVar20 = 0; uVar30 != uVar20; uVar20 = uVar20 + 1) {
    paVar1 = paVar13 + -1;
    auVar4._0_4_ = *(float *)paVar1;
    auVar4._4_4_ = *(float *)((long)paVar1 + 4);
    auVar4._8_4_ = *(float *)((long)paVar1 + 8);
    auVar4._12_4_ =
         *(anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
           *)((long)paVar1 + 0xc);
    VVar5.field_0 =
         (anon_union_16_2_47237d3f_for_Vec3fx_0)
         *(anon_union_16_2_47237d3f_for_Vec3fx_0 *)&paVar13->field_1;
    *(undefined8 *)(pcVar29 + uVar20 * 8) = *(undefined8 *)(paVar13 + -2);
    *(undefined4 *)(pcVar29 + uVar20 * 4 + 0x20) = auVar4._0_4_;
    uVar6 = vextractps_avx(auVar4,1);
    *(undefined4 *)(pcVar29 + uVar20 * 4 + 0x40) = uVar6;
    uVar6 = vextractps_avx(auVar4,2);
    *(undefined4 *)(pcVar29 + uVar20 * 4 + 0x60) = uVar6;
    *(int *)(pcVar29 + uVar20 * 4 + 0x30) = VVar5.field_0._0_4_;
    uVar6 = vextractps_avx((undefined1  [16])VVar5.field_0,1);
    *(undefined4 *)(pcVar29 + uVar20 * 4 + 0x50) = uVar6;
    uVar6 = vextractps_avx((undefined1  [16])VVar5.field_0,2);
    *(undefined4 *)(pcVar29 + uVar20 * 4 + 0x70) = uVar6;
    auVar32 = vminps_avx(auVar32,auVar4);
    aVar34.m128 = (__m128)vmaxps_avx(aVar34.m128,(undefined1  [16])VVar5.field_0);
    paVar13 = paVar13 + 3;
  }
  pfVar14 = bounds[0].bounds.lower.field_0.m128 + 3;
  uVar28 = 0;
  uVar20 = uVar30;
  while (bVar31 = uVar20 != 0, uVar20 = uVar20 - 1, bVar31) {
    uVar28 = uVar28 + (long)(int)*pfVar14;
    pfVar14 = pfVar14 + 0xc;
  }
  if (0xfff < uVar28) {
    pfVar14 = bounds[0].bounds.lower.field_0.m128 + 3;
    for (uVar20 = 0; uVar30 != uVar20; uVar20 = uVar20 + 1) {
      if ((int)*pfVar14 < 0x1000) {
        BVHNRotate<4>::rotate((NodeRef)*(size_t *)(pcVar29 + uVar20 * 8),1);
        pcVar29[uVar20 * 8 + 7] = pcVar29[uVar20 * 8 + 7] | 0x80;
      }
      pfVar14 = pfVar14 + 0xc;
    }
  }
  aVar7 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vinsertps_avx(auVar32,ZEXT416((uint)uVar28),0x30);
  (local_2c8->ref).ptr = (size_t)pcVar29;
  (local_2c8->bounds).lower.field_0 = aVar7;
  (local_2c8->bounds).upper.field_0 = aVar34;
  return local_2c8;
}

Assistant:

ReductionTy recurse(size_t depth, const range<unsigned>& current, Allocator alloc, bool toplevel)
        {
          /* get thread local allocator */
          if (!alloc)
            alloc = createAllocator();

          /* call memory monitor function to signal progress */
          if (toplevel && current.size() <= singleThreadThreshold)
            progressMonitor(current.size());

          /* create leaf node */
          if (unlikely(depth+MIN_LARGE_LEAF_LEVELS >= maxDepth || current.size() <= minLeafSize))
            return createLargeLeaf(depth,current,alloc);

          /* fill all children by always splitting the one with the largest surface area */
          range<unsigned> children[MAX_BRANCHING_FACTOR];
          split(current,children[0],children[1]);
          size_t numChildren = 2;

          while (numChildren < branchingFactor)
          {
            /* find best child with largest number of primitives */
            int bestChild = -1;
            unsigned bestItems = 0;
            for (unsigned int i=0; i<numChildren; i++)
            {
              /* ignore leaves as they cannot get split */
              if (children[i].size() <= minLeafSize)
                continue;

              /* remember child with largest area */
              if (children[i].size() > bestItems) {
                bestItems = children[i].size();
                bestChild = i;
              }
            }
            if (bestChild == -1) break;

            /*! split best child into left and right child */
            range<unsigned> left, right;
            split(children[bestChild],left,right);

            /* add new children left and right */
            children[bestChild] = children[numChildren-1];
            children[numChildren-1] = left;
            children[numChildren+0] = right;
            numChildren++;
          }

          /* create leaf node if no split is possible */
          if (unlikely(numChildren == 1))
            return createLeaf(current,alloc);

          /* allocate node */
          auto node = createNode(alloc,numChildren);

          /* process top parts of tree parallel */
          ReductionTy bounds[MAX_BRANCHING_FACTOR];
          if (current.size() > singleThreadThreshold)
          {
            /*! parallel_for is faster than spawning sub-tasks */
            parallel_for(size_t(0), numChildren, [&] (const range<size_t>& r) {
                for (size_t i=r.begin(); i<r.end(); i++) {
                  bounds[i] = recurse(depth+1,children[i],nullptr,true);
                  _mm_mfence(); // to allow non-temporal stores during build
                }
              });
          }

          /* finish tree sequentially */
          else
          {
            for (size_t i=0; i<numChildren; i++)
              bounds[i] = recurse(depth+1,children[i],alloc,false);
          }

          return setBounds(node,bounds,numChildren);
        }